

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

byte * __thiscall
Js::ByteCodeBufferReader::ReadOneScopeInfo
          (ByteCodeBufferReader *this,byte *current,ByteCodeCache *cache,ScopeInfo **scopeInfo)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  byte *pbVar5;
  FunctionInfo *function;
  undefined4 *puVar6;
  Recycler *alloc;
  ScopeInfo *pSVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte *pbVar12;
  long lVar13;
  int i;
  long lVar14;
  undefined1 local_80 [8];
  TrackAllocData data;
  LocalFunctionId relativeFunctionId;
  Type local_3c;
  uint local_38;
  int scopeType;
  int symbolCount;
  ScopeInfoFlags scopeInfoFlags;
  bool hasParent;
  
  local_38 = 0;
  pbVar5 = ReadInt32(this,current,(int *)&local_38);
  data._36_4_ = 0;
  pbVar5 = ReadUInt32(this,pbVar5,(uint *)&data.field_0x24);
  function = ByteCodeCache::LookupFunctionInfo(cache,this->scriptContext,data._36_4_);
  if (function == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1182,"(functionInfo != nullptr)","functionInfo != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  data.typeinfo = (type_info *)((long)(int)local_38 << 4);
  local_80 = (undefined1  [8])&ScopeInfo::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_36c6a8a;
  data.filename._0_4_ = 0x1184;
  alloc = Memory::Recycler::TrackAllocInfo(this->scriptContext->recycler,(TrackAllocData *)local_80)
  ;
  pSVar7 = (ScopeInfo *)new<Memory::Recycler>(0x30,alloc,0x398e98,0);
  ScopeInfo::ScopeInfo(pSVar7,function,local_38);
  *scopeInfo = pSVar7;
  pbVar5 = ReadByte(this,pbVar5,(byte *)((long)&scopeType + 2));
  bVar1 = scopeType._2_1_ * '\x02';
  *(ushort *)&(*scopeInfo)->field_0x10 =
       (ushort)*(undefined4 *)&(*scopeInfo)->field_0x10 & 0xfffe | scopeType._2_1_ & 1;
  *(ushort *)&(*scopeInfo)->field_0x10 =
       (ushort)*(undefined4 *)&(*scopeInfo)->field_0x10 & 0xfffd | scopeType._2_1_ & 2;
  *(ushort *)&(*scopeInfo)->field_0x10 =
       (ushort)*(undefined4 *)&(*scopeInfo)->field_0x10 & 0xfffb | scopeType._2_1_ & 4;
  *(ushort *)&(*scopeInfo)->field_0x10 =
       (ushort)*(undefined4 *)&(*scopeInfo)->field_0x10 & 0xfff7 | scopeType._2_1_ & 8;
  *(ushort *)&(*scopeInfo)->field_0x10 =
       (ushort)*(undefined4 *)&(*scopeInfo)->field_0x10 & 0xffdf | (ushort)(bVar1 & 0x20);
  *(ushort *)&(*scopeInfo)->field_0x10 =
       (ushort)*(undefined4 *)&(*scopeInfo)->field_0x10 & 0xffbf | (ushort)(bVar1 & 0x40);
  *(ushort *)&(*scopeInfo)->field_0x10 =
       (ushort)*(undefined4 *)&(*scopeInfo)->field_0x10 & 0xff7f | (ushort)(bVar1 & 0x80);
  *(ushort *)&(*scopeInfo)->field_0x10 = *(ushort *)&(*scopeInfo)->field_0x10 & 0xffef;
  pbVar5 = ReadInt32(this,pbVar5,(int *)&local_3c);
  pSVar7 = *scopeInfo;
  pSVar7->scopeType = local_3c;
  pbVar5 = ReadInt32(this,pbVar5,&pSVar7->scopeId);
  if (DAT_0145948a == '\x01') {
    Output::Trace(ByteCodeSerializationPhase,
                  L"Reading ScopeInfo. Flags: %u. Type: %d. ScopeId: %d. Symbol count: %d\n",
                  (ulong)scopeType._2_1_,(ulong)local_3c,(ulong)(uint)(*scopeInfo)->scopeId,
                  (ulong)local_38);
  }
  lVar13 = 0x39;
  for (lVar14 = 0; lVar14 < (int)local_38; lVar14 = lVar14 + 1) {
    pSVar7 = *scopeInfo;
    pbVar5 = ReadByte(this,pbVar5,(byte *)((long)&scopeType + 3));
    bVar8 = scopeType._3_1_ & 1;
    pbVar12 = (byte *)((long)&(pSVar7->parent).ptr + lVar13);
    bVar1 = *pbVar12;
    *pbVar12 = bVar1 & 0xfe | bVar8;
    bVar9 = scopeType._3_1_ & 2;
    *pbVar12 = bVar1 & 0xfc | bVar8 | bVar9;
    bVar10 = scopeType._3_1_ & 4;
    *pbVar12 = bVar1 & 0xf8 | bVar8 | bVar9 | bVar10;
    bVar11 = scopeType._3_1_ & 8;
    *pbVar12 = bVar1 & 0xf0 | bVar8 | bVar9 | bVar10 | bVar11;
    *pbVar12 = bVar1 & 0xe0 | bVar8 | bVar9 | bVar10 | bVar11 | scopeType._3_1_ & 0x10;
    *pbVar12 = bVar1 & 0xc0 | bVar8 | bVar9 | bVar10 | bVar11 | scopeType._3_1_ & 0x10 |
               scopeType._3_1_ & 0x20;
    pbVar5 = ReadByte(this,pbVar5,pbVar12 + -1);
    pbVar5 = ReadInt32(this,pbVar5,(int *)local_80);
    uVar4 = ByteCodeCache::LookupPropertyId(cache,local_80._0_4_);
    *(uint *)(pbVar12 + -9) = uVar4;
    if (DAT_0145948a == '\x01') {
      Output::Trace(ByteCodeSerializationPhase,
                    L"\t\tSymbolInfo. Flags: %u. Type: %d. PropertyId: %u\n",(ulong)scopeType._3_1_,
                    (ulong)pbVar12[-1],(ulong)uVar4);
    }
    lVar13 = lVar13 + 0x10;
  }
  scopeType._3_1_ = '\0';
  pbVar5 = ReadBool(this,pbVar5,(bool *)((long)&scopeType + 3));
  if (scopeType._3_1_ != '\0') {
    local_80 = (undefined1  [8])0x0;
    pbVar5 = ReadScopeInfo(this,pbVar5,cache,(ScopeInfo **)local_80);
    Memory::WriteBarrierPtr<Js::ScopeInfo>::WriteBarrierSet
              (&(*scopeInfo)->parent,(ScopeInfo *)local_80);
  }
  return pbVar5;
}

Assistant:

const byte* ReadOneScopeInfo(const byte* current, ByteCodeCache* cache, ScopeInfo** scopeInfo)
    {
        int symbolCount = 0;
        current = ReadInt32(current, &symbolCount);

        Js::LocalFunctionId relativeFunctionId = 0;
        current = ReadUInt32(current, (uint*)&relativeFunctionId);
        FunctionInfo* functionInfo =  cache->LookupFunctionInfo(this->scriptContext, relativeFunctionId);

        Assert(functionInfo != nullptr);

        *scopeInfo = RecyclerNewPlusZ(scriptContext->GetRecycler(), symbolCount * sizeof(ScopeInfo::SymbolInfo), ScopeInfo, functionInfo, symbolCount);

        ScopeInfoFlags scopeInfoFlags;
        current = ReadByte(current, (byte*)&scopeInfoFlags);
        (*scopeInfo)->isDynamic = (scopeInfoFlags & sifIsDynamic) != 0;
        (*scopeInfo)->isObject = (scopeInfoFlags & sifIsObject) != 0;
        (*scopeInfo)->mustInstantiate = (scopeInfoFlags & sifMustInstantiate) != 0;
        (*scopeInfo)->isCached = (scopeInfoFlags & sifIsCached) != 0;
        (*scopeInfo)->hasLocalInClosure = (scopeInfoFlags & sifHasLocalInClosure) != 0;
        (*scopeInfo)->isGeneratorFunctionBody = (scopeInfoFlags & sifIsGeneratorFunctionBody) != 0;
        (*scopeInfo)->isAsyncFunctionBody = (scopeInfoFlags & sifIsAsyncFunctionBody) != 0;
        (*scopeInfo)->areNamesCached = false;

        int scopeType;
        current = ReadInt32(current, &scopeType);
        (*scopeInfo)->scopeType = (::ScopeType)scopeType;

        current = ReadInt32(current, &(*scopeInfo)->scopeId);

        OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("Reading ScopeInfo. Flags: %u. Type: %d. ScopeId: %d. Symbol count: %d\n"), scopeInfoFlags, scopeType, (*scopeInfo)->scopeId, symbolCount);

        for (int i = 0; i < symbolCount; i++)
        {
            ScopeInfo::SymbolInfo* sym = (*scopeInfo)->symbols + i;

            SymbolInfoFlags symbolInfoFlags;
            current = ReadByte(current, (byte*)&symbolInfoFlags);
            sym->hasFuncAssignment = (symbolInfoFlags & syifHasFuncAssignment) != 0;
            sym->isBlockVariable = (symbolInfoFlags & syifIsBlockVariable) != 0;
            sym->isConst = (symbolInfoFlags & syifIsConst) != 0;
            sym->isFuncExpr = (symbolInfoFlags & syifIsFuncExpr) != 0;
            sym->isModuleExportStorage = (symbolInfoFlags & syifIsModuleExportStorage) != 0;
            sym->isModuleImport = (symbolInfoFlags & syifIsModuleImport) != 0;

            current = ReadByte(current, (BYTE*)&sym->symbolType);

            PropertyId obscuredPropertyId;
            current = ReadInt32(current, (int*)&obscuredPropertyId);
            sym->propertyId = cache->LookupPropertyId(obscuredPropertyId);

            OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("\t\tSymbolInfo. Flags: %u. Type: %d. PropertyId: %u\n"), symbolInfoFlags, sym->symbolType, sym->propertyId);
        }

        bool hasParent = false;
        current = ReadBool(current, &hasParent);

        if (hasParent)
        {
            ScopeInfo* parent = nullptr;
            current = ReadScopeInfo(current, cache, &parent);
            (*scopeInfo)->parent = parent;
        }

        return current;
    }